

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Pgno ptrmapPageno(BtShared *pBt,Pgno pgno)

{
  Pgno PVar1;
  int iVar2;
  
  PVar1 = 0;
  if (1 < pgno) {
    iVar2 = (pgno - 2) - (pgno - 2) % (pBt->usableSize / 5 + 1);
    PVar1 = iVar2 + (uint)(iVar2 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  return PVar1;
}

Assistant:

static Pgno ptrmapPageno(BtShared *pBt, Pgno pgno){
  int nPagesPerMapPage;
  Pgno iPtrMap, ret;
  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno<2 ) return 0;
  nPagesPerMapPage = (pBt->usableSize/5)+1;
  iPtrMap = (pgno-2)/nPagesPerMapPage;
  ret = (iPtrMap*nPagesPerMapPage) + 2;
  if( ret==PENDING_BYTE_PAGE(pBt) ){
    ret++;
  }
  return ret;
}